

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O2

void __thiscall pixels::fillPattern1(pixels *this)

{
  pointer puVar1;
  uint uVar2;
  long lVar3;
  int x;
  int iVar4;
  long lVar5;
  int y;
  int iVar6;
  float f;
  half local_2a;
  
  for (iVar6 = 0; iVar6 < this->_h; iVar6 = iVar6 + 1) {
    for (iVar4 = 0; iVar4 < this->_w; iVar4 = iVar4 + 1) {
      lVar5 = (long)(this->_stride_x * iVar6 + iVar4);
      uVar2 = iVar4 + iVar6 & 1;
      f = (float)uVar2;
      (this->i).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar5] = uVar2;
      (this->f).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar5] = f;
      Imath_3_2::half::half(&local_2a,f);
      puVar1 = (this->h).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
               .super__Vector_impl_data._M_start;
      puVar1[lVar5] = local_2a._h;
      for (lVar3 = 0; lVar3 != 0x60; lVar3 = lVar3 + 0x18) {
        *(unsigned_short *)
         (*(long *)((long)&this->rgba[0].
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_start + lVar3) + lVar5 * 2) =
             puVar1[lVar5];
      }
    }
  }
  return;
}

Assistant:

void fillPattern1 ()
    {
        for (int y = 0; y < _h; ++y)
        {
            for (int x = 0; x < _w; ++x)
            {
                size_t idx = y * _stride_x + x;
                i[idx]     = (x + y) & 1;
                f[idx]     = float (i[idx]);
                h[idx]     = half (f[idx]).bits ();
                for (int c = 0; c < 4; ++c)
                    rgba[c][idx] = h[idx];
            }
        }
    }